

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O2

int CVBBDPrecGetWorkSpace(void *cvode_mem,long *lenrwBBDP,long *leniwBBDP)

{
  long lVar1;
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    line = 0x169;
  }
  else if (*(long *)((long)cvode_mem + 0x410) == 0) {
    msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
    error_code = -2;
    line = 0x171;
  }
  else {
    lVar1 = *(long *)(*(long *)((long)cvode_mem + 0x410) + 0xf0);
    if (lVar1 != 0) {
      *lenrwBBDP = *(long *)(lVar1 + 0x80);
      *leniwBBDP = *(long *)(lVar1 + 0x88);
      return 0;
    }
    msgfmt = "BBD peconditioner memory is NULL. CVBBDPrecInit must be called.";
    error_code = -5;
    line = 0x179;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVBBDPrecGetWorkSpace",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVBBDPrecGetWorkSpace(void* cvode_mem, long int* lenrwBBDP,
                          long int* leniwBBDP)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBBDPrecData pdata;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  if (cvls_mem->P_data == NULL)
  {
    cvProcessError(cv_mem, CVLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_PMEM_NULL);
    return (CVLS_PMEM_NULL);
  }
  pdata = (CVBBDPrecData)cvls_mem->P_data;

  *lenrwBBDP = pdata->rpwsize;
  *leniwBBDP = pdata->ipwsize;

  return (CVLS_SUCCESS);
}